

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HumanPlayerStrategy.cpp
# Opt level: O1

void __thiscall HumanPlayerStrategy::execute(HumanPlayerStrategy *this,Game *game,Player *player)

{
  bool bVar1;
  int iVar2;
  Map *pMVar3;
  string *psVar4;
  ostream *poVar5;
  string choice;
  string local_60;
  string local_40;
  
  Player::rollDice(player);
  Game::resolvePlayer(game,player,true);
  iVar2 = Player::getLifePoints(player);
  if (iVar2 < 1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Player : ",9);
    psVar4 = Player::getPlayerName_abi_cxx11_(player);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(psVar4->_M_dataplus)._M_p,psVar4->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," died while resolving dice",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    return;
  }
  iVar2 = Player::getZone(player);
  if ((iVar2 < 1) || (iVar2 = Player::getZone(player), 6 < iVar2)) {
    pMVar3 = Game::getGameMap(game);
    bVar1 = Map::isManhattanEmpty(pMVar3);
    if (!bVar1) {
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      local_60._M_string_length = 0;
      local_60.field_2._M_local_buf[0] = '\0';
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"There is another player in Manhattan",0x24);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
      std::ostream::put(-0x30);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Do you want to move (M) or stay (S) in current location : ",
                 0x3a);
      Player::getZoneName_abi_cxx11_(&local_40,player);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_40._M_dataplus._M_p,local_40._M_string_length)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"?",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
      std::operator>>((istream *)&std::cin,(string *)&local_60);
      iVar2 = std::__cxx11::string::compare((char *)&local_60);
      if (iVar2 == 0) {
        pMVar3 = Game::getGameMap(game);
        Map::removeRegionOwner(pMVar3,player);
        pMVar3 = Game::getGameMap(game);
        Map::move(pMVar3,player);
      }
      goto LAB_0011a3f5;
    }
    Player::setPhase(player,Move);
    iVar2 = Game::getNumberOfPlayers(game);
    if (iVar2 < 5) {
      Player::setZone(player,1);
      pMVar3 = Game::getGameMap(game);
      Map::removeRegionOwner(pMVar3,player);
      pMVar3 = Game::getGameMap(game);
      Map::setRegionOwner(pMVar3,1,player);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Player : ",9);
      psVar4 = Player::getPlayerName_abi_cxx11_(player);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(psVar4->_M_dataplus)._M_p,psVar4->_M_string_length)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," is in : ",9);
      Player::getZoneName_abi_cxx11_(&local_60,player);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_60._M_dataplus._M_p,local_60._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
    }
    else {
      Player::setZone(player,4);
      pMVar3 = Game::getGameMap(game);
      Map::removeRegionOwner(pMVar3,player);
      pMVar3 = Game::getGameMap(game);
      Map::setRegionOwner(pMVar3,4,player);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Player : ",9);
      psVar4 = Player::getPlayerName_abi_cxx11_(player);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(psVar4->_M_dataplus)._M_p,psVar4->_M_string_length)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," is in : ",9);
      Player::getZoneName_abi_cxx11_(&local_60,player);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_60._M_dataplus._M_p,local_60._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p == &local_60.field_2) goto LAB_0011a40c;
  }
  else {
    Player::setPhase(player,Move);
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    local_60._M_string_length = 0;
    local_60.field_2._M_local_buf[0] = '\0';
    iVar2 = Player::getZone(player);
    if (iVar2 == 1) {
      Player::setZone(player,2);
      pMVar3 = Game::getGameMap(game);
      Map::removeRegionOwner(pMVar3,player);
      pMVar3 = Game::getGameMap(game);
      iVar2 = 2;
    }
    else {
      iVar2 = Player::getZone(player);
      if (iVar2 == 2) {
        Player::setZone(player,3);
        pMVar3 = Game::getGameMap(game);
        Map::removeRegionOwner(pMVar3,player);
        pMVar3 = Game::getGameMap(game);
        iVar2 = 3;
      }
      else {
        iVar2 = Player::getZone(player);
        if (iVar2 == 3) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "You are in Upper Manhattan. Do you wish to stay? (Y | N) ",0x39);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
          std::ostream::put(-0x30);
          std::ostream::flush();
          std::operator>>((istream *)&std::cin,(string *)&local_60);
LAB_0011a48b:
          iVar2 = std::__cxx11::string::compare((char *)&local_60);
          if (iVar2 == 0) {
            pMVar3 = Game::getGameMap(game);
            Map::removeRegionOwner(pMVar3,player);
            pMVar3 = Game::getGameMap(game);
            Map::move(pMVar3,player);
          }
          goto LAB_0011a3f5;
        }
        iVar2 = Player::getZone(player);
        if (iVar2 == 4) {
          Player::setZone(player,5);
          pMVar3 = Game::getGameMap(game);
          Map::removeRegionOwner(pMVar3,player);
          pMVar3 = Game::getGameMap(game);
          iVar2 = 5;
        }
        else {
          iVar2 = Player::getZone(player);
          if (iVar2 != 5) {
            iVar2 = Player::getZone(player);
            if (iVar2 != 6) goto LAB_0011a3f5;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "You are in Upper Manhattan. Do you wish to stay? (Y | N) ",0x39);
            std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
            std::operator>>((istream *)&std::cin,(string *)&local_60);
            goto LAB_0011a48b;
          }
          Player::setZone(player,6);
          pMVar3 = Game::getGameMap(game);
          Map::removeRegionOwner(pMVar3,player);
          pMVar3 = Game::getGameMap(game);
          iVar2 = 6;
        }
      }
    }
    Map::setRegionOwner(pMVar3,iVar2,player);
LAB_0011a3f5:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p == &local_60.field_2) goto LAB_0011a40c;
  }
  operator_delete(local_60._M_dataplus._M_p,
                  CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                           local_60.field_2._M_local_buf[0]) + 1);
LAB_0011a40c:
  Game::buyCards(game,player);
  return;
}

Assistant:

void HumanPlayerStrategy::execute(Game *game, Player *player)
{

    player->rollDice();
    // resolve the dice (mandatory) ordered
    game->resolvePlayer(player, true);

    if(player->getLifePoints() <= 0) {
        cout << "Player : " << player->getPlayerName() << " died while resolving dice" << endl;
        return;
    }
    // move

    // if player is in manhattan
    if(player->getZone()>0 && player->getZone()<7){
        player->setPhase(Player::Phase::Move);
        std::string choice;
        if(player->getZone() == 1) {  // Manhattan Lower 2-4
            player->setZone(2);
            game->getGameMap()->removeRegionOwner(player);
            game->getGameMap()->setRegionOwner(2, player);
        }
        else if(player->getZone() == 2) {  // Manhattan Midtown 2-4
            player->setZone(3);
            game->getGameMap()->removeRegionOwner(player);
            game->getGameMap()->setRegionOwner(3, player);
        }
        else if(player->getZone() == 3) {  // Manhattan Upper 2-4
            cout << "You are in Upper Manhattan. Do you wish to stay? (Y | N) " << endl;
            cin >> choice;
            if (choice == "N"){
                game->getGameMap()->removeRegionOwner(player);
                game->getGameMap()->move(player);
            }
        }
        else if(player->getZone() == 4) {  // Manhattan Lower 5-6
            player->setZone(5);
            game->getGameMap()->removeRegionOwner(player);
            game->getGameMap()->setRegionOwner(5, player);
        }
        else if(player->getZone() == 5) {  // Manhattan Midtown 5-6
            player->setZone(6);
            game->getGameMap()->removeRegionOwner(player);
            game->getGameMap()->setRegionOwner(6, player);
        }
        else if(player->getZone() == 6) {  // Manhattan Upper 5-6
            cout << "You are in Upper Manhattan. Do you wish to stay? (Y | N) " << endl;
            cin >> choice;
            if (choice == "N"){
                game->getGameMap()->removeRegionOwner(player);
                game->getGameMap()->move(player);
            }
        }


    }
    else { // Not in manhattan
        if(game->getGameMap()->isManhattanEmpty()){ // must move to manhattan if empty
            player->setPhase(Player::Phase::Move);
            if (game->getNumberOfPlayers() < 5){
                player->setZone(1);
                game->getGameMap()->removeRegionOwner(player);
                game->getGameMap()->setRegionOwner(1, player);
                cout << "Player : " << player->getPlayerName() << " is in : " << player->getZoneName() << endl;
            }
            else{
                player->setZone(4);
                game->getGameMap()->removeRegionOwner(player);
                game->getGameMap()->setRegionOwner(4, player);
                cout << "Player : " << player->getPlayerName() << " is in : " << player->getZoneName() << endl;
            }
        }
        else{ // there is atleast 1 player in manhattan
            std::string choice;
            cout << "There is another player in Manhattan" << endl;
            cout << "Do you want to move (M) or stay (S) in current location : " << player->getZoneName() << "?" << endl;
            cin >> choice;
            if (choice == "M"){
                game->getGameMap()->removeRegionOwner(player);
                game->getGameMap()->move(player);
            }

        }

    }

    // buy cards (optional)
    game->buyCards(player);
}